

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promp.cpp
# Opt level: O0

VectorXd __thiscall ProMP::generateTrajectory(ProMP *this,int requiredTrajLen)

{
  Scalar SVar1;
  int iVar2;
  size_type sVar3;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  int in_EDX;
  Index extraout_RDX;
  undefined4 in_register_00000034;
  ProMP *this_00;
  CoeffReturnType CVar7;
  double dVar8;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar9;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar10;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar11;
  VectorXd VVar12;
  int local_3c8;
  int i_1;
  double delta;
  non_const_type local_3b0;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  gentrajDemoLen;
  VectorXd sampleW;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_388;
  CoeffReturnType local_378;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_370;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_360;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_0>
  local_330;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_0>_>
  local_2f0;
  non_const_type local_2a0;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_298;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_288;
  CoeffReturnType local_268;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_260;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_250;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
  local_220;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
  local_1d0;
  non_const_type local_170;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_168;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_158;
  undefined1 local_140 [8];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  aux;
  undefined1 local_110 [8];
  VectorXd point;
  undefined1 local_f8 [8];
  VectorXd sig;
  MatrixXd phiT;
  VectorXd phase1;
  undefined1 local_b8 [4];
  int i;
  MatrixXd phi;
  VectorXd newPhase_;
  Phase newPhase;
  int timeSteps;
  undefined1 local_50 [8];
  MatrixXd newStdW;
  VectorXd newMeanW;
  double phaseSpeed;
  ProMP *pPStack_18;
  int requiredTrajLen_local;
  ProMP *this_local;
  VectorXd *gentrajReqLen;
  
  this_00 = (ProMP *)CONCAT44(in_register_00000034,requiredTrajLen);
  phaseSpeed._4_4_ = in_EDX;
  pPStack_18 = this_00;
  this_local = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &newStdW.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,&this_00->meanW_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_50,&this_00->stdW_);
  Phase::Phase((Phase *)&newPhase_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,this_00->dt_,1.0,(int)((double)this_00->trajLength_ / 1.0)
              );
  Phase::getPhase((Phase *)&phi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols);
  generateBasisFunction
            ((MatrixXd *)local_b8,this_00,
             (VectorXd *)
             &phi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             this_00->trajLength_);
  phase1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0;
  while( true ) {
    sVar3 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size(&this_00->viaPoints_);
    if (sVar3 <= (ulong)(long)phase1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_) break;
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[](&this_00->viaPoints_,
                          (long)phase1.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](pDVar4,0);
    Phase::getPhaseFromTime
              ((Phase *)&phiT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols,(int)&newPhase_ + 8);
    generateBasisFunction
              ((MatrixXd *)
               &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               this_00,(VectorXd *)
                       &phiT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,1);
    point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_f8,
               (int *)((long)&point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 4));
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[](&this_00->viaPoints_,
                          (long)phase1.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](pDVar4,2);
    SVar1 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_f8,0);
    *pSVar6 = SVar1;
    aux._36_4_ = 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_110,(int *)&aux.field_0x24);
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[](&this_00->viaPoints_,
                          (long)phase1.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](pDVar4,1);
    SVar1 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_110,0);
    *pSVar6 = SVar1;
    local_170 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows);
    PVar9 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                      ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                       &local_170,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_50)
    ;
    local_168 = PVar9;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
    ::operator*(&local_158,
                (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                 *)&local_168,
                (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               );
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)local_140,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_f8,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_158);
    PVar10 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_50,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows);
    local_260 = PVar10;
    local_268 = Eigen::
                DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>,_0>
                              *)local_140,0);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
    ::operator/(&local_250,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                 *)&local_260,&local_268);
    local_2a0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows);
    PVar11 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                        &local_2a0,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        &newStdW.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols);
    local_298 = PVar11;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_288,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_110,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_298);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
    ::operator*(&local_220,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                 *)&local_250,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                 *)&local_288);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_1d0,
               (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
               &newStdW.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,(MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
                        *)&local_220);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)
               &newStdW.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>_>
                        *)&local_1d0);
    PVar10 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_50,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows);
    local_370 = PVar10;
    local_378 = Eigen::
                DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>,_0>
                              *)local_140,0);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
    ::operator/(&local_360,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                 *)&local_370,&local_378);
    sampleW.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows);
    PVar9 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                      ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                       &sampleW.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_50);
    local_388 = PVar9;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
    ::operator*(&local_330,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                 *)&local_360,
                (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                 *)&local_388);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
              (&local_2f0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_50,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_0>_>
                *)&local_330);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)local_50,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_0>_>_>
                *)&local_2f0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_110);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_f8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &sig.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &phiT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    phase1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         phase1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
         _4_4_ + 1;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)&gentrajDemoLen.m_rhs,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             &newStdW.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  delta = (double)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b8);
  PVar11 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                     ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)&delta,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&gentrajDemoLen.m_rhs);
  gentrajDemoLen.m_lhs.m_matrix = (non_const_type)PVar11.m_rhs;
  local_3b0 = (non_const_type)PVar11.m_lhs.m_matrix;
  iVar2 = this_00->trajLength_;
  dVar8 = (double)phaseSpeed._4_4_;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(int *)((long)&phaseSpeed + 4));
  for (local_3c8 = 0; local_3c8 < phaseSpeed._4_4_; local_3c8 = local_3c8 + 1) {
    CVar7 = Eigen::
            DenseCoeffsBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_0>
                          *)&local_3b0,
                         (long)(int)((double)local_3c8 * ((double)(iVar2 + -1) / dVar8)));
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                        (long)local_3c8);
    *pSVar6 = CVar7;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)&gentrajDemoLen.m_rhs);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_b8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &phi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  Phase::~Phase((Phase *)&newPhase_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_50);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &newStdW.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd ProMP::generateTrajectory(int requiredTrajLen){
	double phaseSpeed = 1.0;
	auto newMeanW = meanW_;
	auto newStdW = stdW_;
	int timeSteps = (int)(trajLength_/phaseSpeed);
	Phase newPhase(dt_,phaseSpeed,timeSteps);
	auto newPhase_ = newPhase.getPhase();
	auto phi = generateBasisFunction(newPhase_,trajLength_);
	for(int i=0;i<viaPoints_.size();++i){
		auto phase1 = newPhase.getPhaseFromTime(viaPoints_[i][0]);
		auto phiT = generateBasisFunction(phase1,1);
		Eigen::VectorXd sig(1);
		sig(0) = viaPoints_[i][2];
		Eigen::VectorXd point(1);
		point(0) = viaPoints_[i][1];
		auto aux = sig + (phiT.transpose()*newStdW)*phiT;
		newMeanW = newMeanW + (newStdW*phiT/aux(0))*(point - phiT.transpose()*newMeanW);
		newStdW = newStdW - (newStdW*phiT/aux(0)) * (phiT.transpose()*newStdW);
		}
	auto sampleW = newMeanW;
	auto gentrajDemoLen =  phi.transpose()*sampleW;
	double delta = (trajLength_-1)*1.0/(requiredTrajLen);
	Eigen::VectorXd gentrajReqLen(requiredTrajLen);
	for (int i=0;i<requiredTrajLen;++i){
		gentrajReqLen(i) = gentrajDemoLen((int)(i*delta));
		}
	return gentrajReqLen;
	}